

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbfgsb.c
# Opt level: O0

int hpsolb_(integer *n,doublereal *t,integer *iorder,integer *iheap)

{
  int iVar1;
  integer i__1;
  integer *iheap_local;
  integer *iorder_local;
  doublereal *t_local;
  integer *n_local;
  
  if (*iheap == 0) {
    iVar1 = *n;
    for (hpsolb_::k = 2; hpsolb_::k <= iVar1; hpsolb_::k = hpsolb_::k + 1) {
      hpsolb_::ddum = t[(long)hpsolb_::k + -1];
      hpsolb_::indxin = iorder[(long)hpsolb_::k + -1];
      hpsolb_::i__ = hpsolb_::k;
      while ((1 < hpsolb_::i__ &&
             (hpsolb_::j = hpsolb_::i__ / 2, hpsolb_::ddum < t[(long)hpsolb_::j + -1]))) {
        t[(long)hpsolb_::i__ + -1] = t[(long)hpsolb_::j + -1];
        iorder[(long)hpsolb_::i__ + -1] = iorder[(long)hpsolb_::j + -1];
        hpsolb_::i__ = hpsolb_::j;
      }
      t[(long)hpsolb_::i__ + -1] = hpsolb_::ddum;
      iorder[(long)hpsolb_::i__ + -1] = hpsolb_::indxin;
    }
  }
  if (1 < *n) {
    hpsolb_::i__ = 1;
    hpsolb_::out = *t;
    hpsolb_::indxou = *iorder;
    hpsolb_::ddum = t[(long)*n + -1];
    hpsolb_::indxin = iorder[(long)*n + -1];
    while (hpsolb_::j = hpsolb_::i__ * 2, hpsolb_::j <= *n + -1) {
      if (t[(long)(hpsolb_::j + 1) + -1] < t[(long)hpsolb_::j + -1]) {
        hpsolb_::j = hpsolb_::j + 1;
      }
      if (hpsolb_::ddum <= t[(long)hpsolb_::j + -1]) break;
      t[(long)hpsolb_::i__ + -1] = t[(long)hpsolb_::j + -1];
      iorder[(long)hpsolb_::i__ + -1] = iorder[(long)hpsolb_::j + -1];
      hpsolb_::i__ = hpsolb_::j;
    }
    t[(long)hpsolb_::i__ + -1] = hpsolb_::ddum;
    iorder[(long)hpsolb_::i__ + -1] = hpsolb_::indxin;
    t[(long)*n + -1] = hpsolb_::out;
    iorder[(long)*n + -1] = hpsolb_::indxou;
  }
  return 0;
}

Assistant:

int hpsolb_(integer *n, doublereal *t, integer *iorder, 
	integer *iheap)
{
    /* System generated locals */
    integer i__1;

    /* Local variables */
    static integer i__, j, k;
    static doublereal out, ddum;
    static integer indxin, indxou;

/*     ************ */

/*     Subroutine hpsolb */

/*     This subroutine sorts out the least element of t, and puts the */
/*       remaining elements of t in a heap. */

/*     n is an integer variable. */
/*       On entry n is the dimension of the arrays t and iorder. */
/*       On exit n is unchanged. */

/*     t is a double precision array of dimension n. */
/*       On entry t stores the elements to be sorted, */
/*       On exit t(n) stores the least elements of t, and t(1) to t(n-1) */
/*         stores the remaining elements in the form of a heap. */

/*     iorder is an integer array of dimension n. */
/*       On entry iorder(i) is the index of t(i). */
/*       On exit iorder(i) is still the index of t(i), but iorder may be */
/*         permuted in accordance with t. */

/*     iheap is an integer variable specifying the task. */
/*       On entry iheap should be set as follows: */
/*         iheap .eq. 0 if t(1) to t(n) is not in the form of a heap, */
/*         iheap .ne. 0 if otherwise. */
/*       On exit iheap is unchanged. */


/*     References: */
/*       Algorithm 232 of CACM (J. W. J. Williams): HEAPSORT. */

/*                           *  *  * */

/*     NEOS, November 1994. (Latest revision June 1996.) */
/*     Optimization Technology Center. */
/*     Argonne National Laboratory and Northwestern University. */
/*     Written by */
/*                        Ciyou Zhu */
/*     in collaboration with R.H. Byrd, P. Lu-Chen and J. Nocedal. */

/*     ************ */
    /* Parameter adjustments */
    --iorder;
    --t;

    /* Function Body */
    if (*iheap == 0) {
/*        Rearrange the elements t(1) to t(n) to form a heap. */
	i__1 = *n;
	for (k = 2; k <= i__1; ++k) {
	    ddum = t[k];
	    indxin = iorder[k];
/*           Add ddum to the heap. */
	    i__ = k;
L10:
	    if (i__ > 1) {
		j = i__ / 2;
		if (ddum < t[j]) {
		    t[i__] = t[j];
		    iorder[i__] = iorder[j];
		    i__ = j;
		    goto L10;
		}
	    }
	    t[i__] = ddum;
	    iorder[i__] = indxin;
/* L20: */
	}
    }
/*     Assign to 'out' the value of t(1), the least member of the heap, */
/*        and rearrange the remaining members to form a heap as */
/*        elements 1 to n-1 of t. */
    if (*n > 1) {
	i__ = 1;
	out = t[1];
	indxou = iorder[1];
	ddum = t[*n];
	indxin = iorder[*n];
/*        Restore the heap */
L30:
	j = i__ + i__;
	if (j <= *n - 1) {
	    if (t[j + 1] < t[j]) {
		++j;
	    }
	    if (t[j] < ddum) {
		t[i__] = t[j];
		iorder[i__] = iorder[j];
		i__ = j;
		goto L30;
	    }
	}
	t[i__] = ddum;
	iorder[i__] = indxin;
/*     Put the least member in t(n). */
	t[*n] = out;
	iorder[*n] = indxou;
    }
    return 0;
}